

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::process_transformed<charls::transform_none<unsigned_short>_>::decode_transform
          (process_transformed<charls::transform_none<unsigned_short>_> *this,void *source,
          void *destination,size_t pixel_count,size_t byte_stride)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  undefined4 uVar4;
  interleave_mode iVar5;
  long lVar6;
  undefined2 *puVar7;
  size_t sVar8;
  size_t sVar9;
  undefined4 *puVar10;
  
  iVar3 = this->frame_info_->component_count;
  if (iVar3 == 4) {
    iVar5 = this->parameters_->interleave_mode;
    if (iVar5 == Line) {
      sVar8 = pixel_count;
      if (byte_stride < pixel_count) {
        sVar8 = byte_stride;
      }
      if (sVar8 != 0) {
        sVar9 = 0;
        do {
          *(ulong *)((long)destination + sVar9 * 8) =
               CONCAT26(*(undefined2 *)((long)source + sVar9 * 2 + byte_stride * 6),
                        CONCAT24(*(undefined2 *)((long)source + sVar9 * 2 + byte_stride * 4),
                                 CONCAT22(*(undefined2 *)
                                           ((long)source + sVar9 * 2 + byte_stride * 2),
                                          *(undefined2 *)((long)source + sVar9 * 2))));
          sVar9 = sVar9 + 1;
        } while (sVar8 != sVar9);
      }
    }
    else if ((iVar5 == Sample) && (pixel_count != 0)) {
      sVar8 = 0;
      do {
        *(undefined8 *)((long)destination + sVar8 * 8) = *(undefined8 *)((long)source + sVar8 * 8);
        sVar8 = sVar8 + 1;
      } while (pixel_count != sVar8);
    }
  }
  else if (iVar3 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      if (pixel_count != 0) {
        lVar6 = 0;
        sVar8 = pixel_count;
        do {
          uVar4 = *(undefined4 *)((long)source + lVar6);
          *(undefined2 *)((long)destination + lVar6 + 4) = *(undefined2 *)((long)source + lVar6 + 4)
          ;
          *(undefined4 *)((long)destination + lVar6) = uVar4;
          lVar6 = lVar6 + 6;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
      }
    }
    else {
      sVar8 = pixel_count;
      if (byte_stride < pixel_count) {
        sVar8 = byte_stride;
      }
      if (sVar8 != 0) {
        sVar9 = 0;
        puVar10 = (undefined4 *)destination;
        do {
          uVar2 = *(undefined2 *)((long)source + sVar9 * 2);
          uVar1 = *(undefined2 *)((long)source + sVar9 * 2 + byte_stride * 2);
          *(undefined2 *)(puVar10 + 1) = *(undefined2 *)((long)source + sVar9 * 2 + byte_stride * 4)
          ;
          *puVar10 = CONCAT22(uVar1,uVar2);
          sVar9 = sVar9 + 1;
          puVar10 = (undefined4 *)((long)puVar10 + 6);
        } while (sVar8 != sVar9);
      }
    }
  }
  if ((this->parameters_->output_bgr == true) && (pixel_count != 0)) {
    iVar3 = this->frame_info_->component_count;
    puVar7 = (undefined2 *)((long)destination + 4);
    do {
      uVar2 = puVar7[-2];
      puVar7[-2] = *puVar7;
      *puVar7 = uVar2;
      puVar7 = puVar7 + iVar3;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void decode_transform(const void* source, void* destination, const size_t pixel_count, const size_t byte_stride) noexcept
    {
        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else
            {
                transform_line_to_triplet(static_cast<const size_type*>(source), byte_stride,
                                          static_cast<triplet<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_line_to_quad(static_cast<const size_type*>(source), byte_stride,
                                       static_cast<quad<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }

        if (parameters_.output_bgr)
        {
            transform_rgb_to_bgr(static_cast<size_type*>(destination), frame_info_.component_count, pixel_count);
        }
    }